

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
booster::locale::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,date_time *t)

{
  ulong uVar1;
  double dVar2;
  
  dVar2 = (double)booster::locale::date_time::time();
  booster::locale::ios_info::get((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  uVar1 = booster::locale::ios_info::display_flags();
  if ((uVar1 & 0xfffffffffffffffc) == 4) {
    std::ostream::_M_insert<double>(dVar2);
  }
  else {
    uVar1 = booster::locale::ios_info::get((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
    booster::locale::ios_info::display_flags(uVar1);
    std::ostream::_M_insert<double>(dVar2);
    uVar1 = booster::locale::ios_info::get((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
    booster::locale::ios_info::display_flags(uVar1);
  }
  return out;
}

Assistant:

std::basic_ostream<CharType> &operator<<(std::basic_ostream<CharType> &out,date_time const &t)
        {
            double time_point = t.time();
            uint64_t display_flags = ios_info::get(out).display_flags();
            if  (
                    display_flags == flags::date 
                    || display_flags == flags::time 
                    || display_flags == flags::datetime 
                    || display_flags == flags::strftime
                ) 
            {
                out << time_point;
            }
            else {
                ios_info::get(out).display_flags(flags::datetime);
                out << time_point;
                ios_info::get(out).display_flags(display_flags);
            }
            return out;
        }